

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O2

void msgpack::v1::
     StdTupleConverter<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_2UL>
     ::convert(object *o,
              tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *v)

{
  StdTupleConverter<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_1UL>
  ::convert(o,v);
  if (1 < (o->super_object).via.array.size) {
    object::convert<std::__cxx11::string>
              (&(((o->super_object).via.map.ptr)->val).super_object,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
    return;
  }
  return;
}

Assistant:

static void convert(
        msgpack::object const& o,
        Tuple& v) {
        StdTupleConverter<Tuple, N-1>::convert(o, v);
        if (o.via.array.size >= N)
            o.via.array.ptr[N-1].convert<typename std::remove_reference<decltype(std::get<N-1>(v))>::type>(std::get<N-1>(v));
    }